

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O3

void * defaultRealloc(TidyAllocator *allocator,void *mem,size_t newsize)

{
  void *pvVar1;
  
  if (mem != (void *)0x0) {
    if (g_realloc == (TidyRealloc)0x0) {
      pvVar1 = realloc(mem,newsize);
    }
    else {
      pvVar1 = (*g_realloc)(mem,newsize);
    }
    if (pvVar1 == (void *)0x0) {
      defaultPanic((TidyAllocator *)mem,"Out of memory!");
      pvVar1 = (void *)0x0;
    }
    return pvVar1;
  }
  pvVar1 = defaultAlloc(allocator,newsize);
  return pvVar1;
}

Assistant:

static void* TIDY_CALL defaultRealloc( TidyAllocator* allocator, void* mem, size_t newsize )
{
    void *p;
    if ( mem == NULL )
        return defaultAlloc( allocator, newsize );

    p = ( g_realloc ? g_realloc(mem, newsize) : realloc(mem, newsize) );
    if (!p)
        defaultPanic( allocator, "Out of memory!");
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_MEMORY)
    realloccnt++;
    SPRTF("%d: realloc MEM %p, size %d\n", realloccnt, p, (int)newsize );
#endif
    return p;
}